

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

void session_destroy(SESSION_HANDLE session)

{
  if (session != (SESSION_HANDLE)0x0) {
    session_end(session,(char *)0x0,(char *)0x0);
    connection_destroy_endpoint(session->endpoint);
    if (session->link_endpoints != (LINK_ENDPOINT_INSTANCE **)0x0) {
      free(session->link_endpoints);
    }
    free(session);
    return;
  }
  return;
}

Assistant:

void session_destroy(SESSION_HANDLE session)
{
    /* Codes_S_R_S_SESSION_01_036: [If session is NULL, session_destroy shall do nothing.] */
    if (session != NULL)
    {
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)session;

        session_end(session, NULL, NULL);

        /* Codes_S_R_S_SESSION_01_034: [session_destroy shall free all resources allocated by session_create.] */
        /* Codes_S_R_S_SESSION_01_035: [The endpoint created in session_create shall be freed by calling connection_destroy_endpoint.] */
        connection_destroy_endpoint(session_instance->endpoint);
        if (session_instance->link_endpoints != NULL)
        {
            free(session_instance->link_endpoints);
        }

        free(session);
    }
}